

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void md5_128(void *key,int len,uint32_t seed,void *out)

{
  uint in_EDX;
  md5_context ctx;
  int in_stack_ffffffffffffff04;
  ulong in_stack_ffffffffffffff08;
  md5_context *in_stack_ffffffffffffff10;
  uchar *in_stack_ffffffffffffff28;
  md5_context *in_stack_ffffffffffffff30;
  
  md5_starts((md5_context *)&stack0xfffffffffffffef8);
  md5_update(in_stack_ffffffffffffff10,(uchar *)(in_EDX ^ in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff04);
  md5_finish(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  return;
}

Assistant:

inline void md5_128(const void *key, int len, uint32_t seed, void *out) {
  md5_context ctx;
  md5_starts( &ctx );
  ctx.state[0] ^= seed;
  md5_update( &ctx, (unsigned char *)key, len );
  md5_finish( &ctx, (unsigned char *)out );
  //memset( &ctx.buffer, 0, 64+64+64 ); // for buffer, ipad, opad
}